

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict get_adjacent_member(node_t_conflict member,int next_p)

{
  node_t_conflict pnVar1;
  node_t pnVar2;
  
  if (member->code != N_MEMBER) {
    __assert_fail("member->code == N_MEMBER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1ca0,"node_t get_adjacent_member(node_t, int)");
  }
  pnVar1 = (&(member->op_link).prev)[next_p != 0];
  if (pnVar1 != (node_t_conflict)0x0) {
    do {
      if (pnVar1->code == N_MEMBER) {
        pnVar2 = (pnVar1->u).ops.head;
        if (pnVar2 != (node_t)0x0) {
          pnVar2 = (pnVar2->op_link).next;
        }
        if (pnVar2->code != N_IGNORE) {
          return pnVar1;
        }
        if ((pnVar1->attr != (void *)0x0) &&
           (*(char *)(*(long *)((long)pnVar1->attr + 0x40) + 0x1d) != '\0')) {
          return pnVar1;
        }
      }
      pnVar1 = (&(pnVar1->op_link).prev)[next_p != 0];
    } while (pnVar1 != (node_t)0x0);
  }
  return pnVar1;
}

Assistant:

static node_t get_adjacent_member (node_t member, int next_p) {
  assert (member->code == N_MEMBER);
  while ((member = next_p ? NL_NEXT (member) : NL_PREV (member)) != NULL)
    if (member->code == N_MEMBER
        && (NL_EL (member->u.ops, 1)->code != N_IGNORE || anon_struct_union_type_member_p (member)))
      break;
  return member;
}